

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O0

int testBeta1OutOfAllowedRange(void)

{
  NeuralNetwork *nn_00;
  ostream *poVar1;
  undefined1 local_80 [8];
  Result res;
  NeuralNetwork *nn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&nn);
  nn_00 = buildBasicUpdatableNeuralNetworkModel((Model *)&nn);
  addBeta1(nn_00,kAdamOptimizer,5.0,0.10000000149011612,1.0);
  CoreML::Model::validate((Result *)local_80,(Model *)&nn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_80);
  if (m._oneof_case_[0]._0_1_) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/ParameterTests.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x15d);
    poVar1 = std::operator<<(poVar1,": error: ");
    poVar1 = std::operator<<(poVar1,"!((res).good())");
    poVar1 = std::operator<<(poVar1," was false, expected true.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_80);
  CoreML::Specification::Model::~Model((Model *)&nn);
  return m._oneof_case_[0];
}

Assistant:

int testBeta1OutOfAllowedRange() {
    
    Specification::Model m;
    
    // basic neural network model without any updatable model parameters.
    auto nn = buildBasicUpdatableNeuralNetworkModel(m);
    
    addBeta1(nn, Specification::Optimizer::kAdamOptimizer, 5.0f, 0.1f, 1.0f);
    
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    return 0;
}